

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O0

state_status_t
tchecker::syncprod::next
          (system_t *system,vloc_sptr_t *vloc,vedge_sptr_t *vedge,sync_id_t *sync_id,
          outgoing_edges_value_t *sync_edges)

{
  loc_id_t lVar1;
  bool bVar2;
  capacity_t cVar3;
  capacity_t cVar4;
  process_id_t pVar5;
  loc_id_t lVar6;
  loc_id_t lVar7;
  edge_id_t eVar8;
  vloc_t *this;
  vedge_t *this_00;
  invalid_argument *piVar9;
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *pmVar10;
  uint *puVar11;
  edges_iterator_t *peVar12;
  element_type *peVar13;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *pmVar14;
  undefined1 local_b8 [24];
  edge_const_shared_ptr_t *edge;
  undefined1 local_98 [8];
  edges_iterator_t __end2;
  edges_iterator_t __begin2;
  range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t> *__range2;
  process_id_t pid;
  capacity_t size;
  outgoing_edges_value_t *sync_edges_local;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  this = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
          operator->(vloc)->super_vloc_t;
  cVar3 = vloc_t::size(this);
  this_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
             ::operator->(vedge)->super_vedge_t;
  cVar4 = vedge_t::size(this_00);
  if (cVar3 != cVar4) {
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar9,"incompatible vloc and vedge");
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (__range2._0_4_ = 0; (capacity_t)__range2 < cVar3; __range2._0_4_ = (capacity_t)__range2 + 1)
  {
    pmVar10 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
              ::operator*(vedge);
    puVar11 = make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t>::operator[]
                        (pmVar10,(capacity_t)__range2);
    *puVar11 = 0xffffffff;
  }
  peVar12 = range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::
            begin(&sync_edges->edges);
  edges_iterator_t::edges_iterator_t((edges_iterator_t *)&__end2._sync_it,peVar12);
  peVar12 = range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::end
                      (&sync_edges->edges);
  edges_iterator_t::edges_iterator_t((edges_iterator_t *)local_98,peVar12);
  while( true ) {
    bVar2 = edges_iterator_t::operator!=
                      ((edges_iterator_t *)&__end2._sync_it,(edges_iterator_t *)local_98);
    if (!bVar2) break;
    edges_iterator_t::operator*((edges_iterator_t *)local_b8);
    local_b8._16_8_ = local_b8;
    peVar13 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b8._16_8_);
    pVar5 = tchecker::system::edge_t::pid(peVar13);
    if (cVar3 <= pVar5) {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar9,"incompatible edges");
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pmVar14 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*(vloc);
    peVar13 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b8._16_8_);
    pVar5 = tchecker::system::edge_t::pid(peVar13);
    puVar11 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[](pmVar14,pVar5);
    lVar1 = *puVar11;
    peVar13 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b8._16_8_);
    lVar6 = tchecker::system::edge_t::src(peVar13);
    if (lVar1 == lVar6) {
      peVar13 = std::
                __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b8._16_8_);
      lVar7 = tchecker::system::edge_t::tgt(peVar13);
      pmVar14 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
                intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                ::operator*(vloc);
      peVar13 = std::
                __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b8._16_8_);
      pVar5 = tchecker::system::edge_t::pid(peVar13);
      puVar11 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[](pmVar14,pVar5);
      *puVar11 = lVar7;
      peVar13 = std::
                __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b8._16_8_);
      eVar8 = tchecker::system::edge_t::id(peVar13);
      pmVar10 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)
                intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
                ::operator*(vedge);
      peVar13 = std::
                __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b8._16_8_);
      pVar5 = tchecker::system::edge_t::pid(peVar13);
      puVar11 = make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t>::operator[](pmVar10,pVar5);
      *puVar11 = eVar8;
    }
    else {
      system_local._4_4_ = 2;
    }
    edge._4_4_ = (uint)(lVar1 != lVar6);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_b8);
    if (edge._4_4_ != 0) goto LAB_00208942;
    edges_iterator_t::operator++((edges_iterator_t *)&__end2._sync_it);
  }
  edge._4_4_ = 5;
LAB_00208942:
  edges_iterator_t::~edges_iterator_t((edges_iterator_t *)local_98);
  edges_iterator_t::~edges_iterator_t((edges_iterator_t *)&__end2._sync_it);
  if (edge._4_4_ != 1) {
    *sync_id = sync_edges->sync_id;
    system_local._4_4_ = 1;
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t next(tchecker::syncprod::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::syncprod::outgoing_edges_value_t const & sync_edges)
{
  auto size = vloc->size();
  if (size != vedge->size())
    throw std::invalid_argument("incompatible vloc and vedge");

  for (tchecker::process_id_t pid = 0; pid < size; ++pid)
    (*vedge)[pid] = tchecker::NO_EDGE;

  for (tchecker::system::edge_const_shared_ptr_t const & edge : sync_edges.edges) {
    if (edge->pid() >= size)
      throw std::invalid_argument("incompatible edges");
    if ((*vloc)[edge->pid()] != edge->src())
      return tchecker::STATE_INCOMPATIBLE_EDGE;
    (*vloc)[edge->pid()] = edge->tgt();
    (*vedge)[edge->pid()] = edge->id();
  }

  sync_id = sync_edges.sync_id;

  return tchecker::STATE_OK;
}